

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_subi_i64_arm(TCGContext_conflict *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,int64_t arg2)

{
  TCGv_i64 arg2_00;
  TCGOp *pTVar1;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_1;
  
  if (arg2 != 0) {
    arg2_00 = tcg_const_i64_arm(tcg_ctx,arg2);
    tcg_gen_sub_i64(tcg_ctx,ret,arg1,arg2_00);
    tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(arg2_00 + (long)tcg_ctx));
    return;
  }
  if (ret != arg1) {
    pTVar1 = tcg_emit_op_arm(tcg_ctx,INDEX_op_mov_i64);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  }
  return;
}

Assistant:

void tcg_gen_subi_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, int64_t arg2)
{
    /* some cases can be optimized here */
    if (arg2 == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
    } else {
        TCGv_i64 t0 = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_sub_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
}